

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<cs::type_t> * __thiscall
cs::allocator_type<cs_impl::any::holder<cs::type_t>,64ul,cs_impl::default_allocator_provider>::
alloc<std::function<cs_impl::any()>const&,std::type_index_const&>
          (allocator_type<cs_impl::any::holder<cs::type_t>,_64UL,_cs_impl::default_allocator_provider>
           *this,function<cs_impl::any_()> *args,type_index *args_1)

{
  type_info *ptVar1;
  __int_type _Var2;
  holder<cs::type_t> *__args;
  holder<cs::type_t> *in_RDX;
  new_allocator<cs_impl::any::holder<cs::type_t>_> *in_RSI;
  type_index *in_RDI;
  holder<cs::type_t> *ptr;
  void *pvVar3;
  
  pvVar3 = (void *)0x0;
  if (in_RDI[0x41]._M_target != (type_info *)0x0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)in_RDX);
    if (_Var2 == 0) {
      ptVar1 = in_RDI[0x41]._M_target;
      in_RDI[0x41]._M_target = ptVar1 + -1;
      __args = (holder<cs::type_t> *)in_RDI[(long)(ptVar1 + -1)]._M_target;
      goto LAB_0054c354;
    }
  }
  __args = __gnu_cxx::new_allocator<cs_impl::any::holder<cs::type_t>_>::allocate
                     (in_RSI,(size_type)in_RDX,pvVar3);
LAB_0054c354:
  __gnu_cxx::new_allocator<cs_impl::any::holder<cs::type_t>>::
  construct<cs_impl::any::holder<cs::type_t>,std::function<cs_impl::any()>const&,std::type_index_const&>
            (in_RSI,in_RDX,(function<cs_impl::any_()> *)__args,in_RDI);
  return __args;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}